

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Write<int> __thiscall
Omega_h::divide_each<int>(Omega_h *this,Read<int> *a,Read<int> *b,string *name)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  size_t sVar2;
  size_t sVar3;
  Write<int> WVar4;
  type f;
  type local_68;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  pAVar1 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  local_68.width = divide_no_remainder<int>((int)(sVar3 >> 2),(int)(sVar2 >> 2));
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  Write<int>::Write((Write<int> *)this,(LO)(sVar3 >> 2),name);
  Write<int>::Write((Write<int> *)&local_68.c,(Write<int> *)this);
  Write<int>::Write((Write<int> *)&local_68.a,&a->write_);
  Write<int>::Write((Write<int> *)&local_68.b,&b->write_);
  pAVar1 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  parallel_for<Omega_h::divide_each<int>(Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::_lambda(int)_1_>
            ((LO)(sVar3 >> 2),&local_68,"divide_each");
  divide_each<int>(Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::
  {lambda(int)#1}::~basic_string((_lambda_int__1_ *)&local_68);
  WVar4.shared_alloc_.direct_ptr = extraout_RDX;
  WVar4.shared_alloc_.alloc = (Alloc *)this;
  return (Write<int>)WVar4.shared_alloc_;
}

Assistant:

Write<T> divide_each(Read<T> a, Read<T> b, std::string const& name) {
  auto width = divide_no_remainder(a.size(), b.size());
  Write<T> c(a.size(), name);
  auto f = OMEGA_H_LAMBDA(LO i) {
    for (Int j = 0; j < width; ++j) {
      c[i * width + j] = a[i * width + j] / b[i];
    }
  };
  parallel_for(b.size(), f, "divide_each");
  return c;
}